

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieparser.cpp
# Opt level: O0

void __thiscall
LottieParserImpl::LottieParserImpl
          (LottieParserImpl *this,char *str,string *dir_path,ColorFilter *filter)

{
  function<void_(float_&,_float_&,_float_&)> *in_RCX;
  string *in_RDX;
  LookaheadParserHandler *in_RDI;
  
  LookaheadParserHandler::LookaheadParserHandler(in_RDI,(char *)in_RCX);
  std::function<void_(float_&,_float_&,_float_&)>::function
            ((function<void_(float_&,_float_&,_float_&)> *)in_RDI,in_RCX);
  {unnamed_type#1}::LottieParserImpl((anon_struct_104_5_f978448e_for_mPathInfo *)in_RDI);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VInterpolator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VInterpolator_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VInterpolator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VInterpolator_*>_>_>
                   *)0x18d7d9);
  std::shared_ptr<rlottie::internal::model::Composition>::shared_ptr
            ((shared_ptr<rlottie::internal::model::Composition> *)0x18d7ea);
  *(undefined8 *)&in_RDI[2].r_.state_ = 0;
  in_RDI[2].ss_.src_ = (Ch *)0x0;
  std::vector<rlottie::internal::model::Layer_*,_std::allocator<rlottie::internal::model::Layer_*>_>
  ::vector((vector<rlottie::internal::model::Layer_*,_std::allocator<rlottie::internal::model::Layer_*>_>
            *)0x18d811);
  std::__cxx11::string::string((string *)(in_RDI[3].v_.data_.ss.str + 8),in_RDX);
  return;
}

Assistant:

LottieParserImpl(char *str, std::string dir_path, model::ColorFilter filter)
        : LookaheadParserHandler(str),
          mColorFilter(std::move(filter)),
          mDirPath(std::move(dir_path))
    {
    }